

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

uint32_t ExtraCost_C(uint32_t *population,int length)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = population[5] + population[4];
  if (7 < length) {
    uVar2 = 2;
    do {
      uVar1 = uVar1 + (int)uVar2 * (population[uVar2 * 2 + 3] + population[uVar2 * 2 + 2]);
      uVar2 = uVar2 + 1;
    } while (((uint)length >> 1) - 1 != uVar2);
  }
  return uVar1;
}

Assistant:

static uint32_t ExtraCost_C(const uint32_t* population, int length) {
  int i;
  uint32_t cost = population[4] + population[5];
  assert(length % 2 == 0);
  for (i = 2; i < length / 2 - 1; ++i) {
    cost += i * (population[2 * i + 2] + population[2 * i + 3]);
  }
  return cost;
}